

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

void __thiscall
DynamicGraph::bfs(DynamicGraph *this,Vertex *s,vector<bool,_std::allocator<bool>_> *visited,
                 unsigned_long startingLevel)

{
  ulong *puVar1;
  undefined8 ******ppppppuVar2;
  pointer psVar3;
  pointer psVar4;
  _Bit_type *p_Var5;
  pointer puVar6;
  undefined8 *******pppppppuVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  ulong uVar11;
  pointer psVar12;
  AdjList *g;
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  undefined8 *******local_50;
  undefined8 *******local_48;
  long local_40;
  undefined8 ******local_38;
  
  local_40 = 0;
  (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[*s] = startingLevel;
  uVar11 = *s;
  uVar8 = uVar11 + 0x3f;
  if (-1 < (long)uVar11) {
    uVar8 = uVar11;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar8 >> 6) +
           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
  (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[*s] = this->nextComponent;
  local_50 = &local_50;
  local_48 = &local_50;
  p_Var9 = (_List_node_base *)operator_new(0x18);
  p_Var9[1]._M_next = (_List_node_base *)*s;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_40 = local_40 + 1;
  if ((undefined8 ********)local_50 != &local_50) {
    do {
      pppppppuVar7 = local_50;
      ppppppuVar2 = local_50[2];
      local_40 = local_40 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pppppppuVar7,0x18);
      psVar3 = (this->super_UndirectedGraph).super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&psVar3[(long)ppppppuVar2].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                + 8);
      local_38 = ppppppuVar2;
      for (psVar12 = *(pointer *)
                      &psVar3[(long)ppppppuVar2].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
          ; psVar12 != psVar4; psVar12 = psVar12 + 1) {
        p_Var9 = (_List_node_base *)(psVar12->super_stored_edge<unsigned_long>).m_target;
        p_Var10 = (_List_node_base *)((long)&p_Var9[3]._M_prev + 7);
        if (-1 < (long)p_Var9) {
          p_Var10 = p_Var9;
        }
        p_Var5 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar11 = (ulong)(((ulong)p_Var9 & 0x800000000000003f) < 0x8000000000000001);
        if ((p_Var5[((long)p_Var10 >> 6) + uVar11 + 0xffffffffffffffff] >> ((ulong)p_Var9 & 0x3f) &
            1) == 0) {
          puVar6 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar6[(long)p_Var9] = puVar6[(long)local_38] + 1;
          (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[(long)p_Var9] = this->nextComponent;
          puVar1 = p_Var5 + ((long)p_Var10 >> 6) + uVar11 + 0xffffffffffffffff;
          *puVar1 = *puVar1 | 1L << ((byte)p_Var9 & 0x3f);
          p_Var10 = (_List_node_base *)operator_new(0x18);
          p_Var10[1]._M_next = p_Var9;
          std::__detail::_List_node_base::_M_hook(p_Var10);
          local_40 = local_40 + 1;
        }
      }
    } while ((undefined8 ********)local_50 != &local_50);
  }
  return;
}

Assistant:

void DynamicGraph::bfs(const Vertex &s, std::vector<bool> &visited, const unsigned long startingLevel)
{
    std::list<Vertex> queue;
    this->level[s] = startingLevel;
    visited[s]=true;
    this->components[s] = this->nextComponent;
    queue.push_back(s);

    // Basic BFS
    while(!queue.empty()) {
        Vertex v = queue.front();
        queue.pop_front();

        OutEdgeIterator ei, ei_end;
        for(boost::tie(ei, ei_end) = out_edges(v, *this); ei != ei_end; ++ei) {
            Vertex u = target(*ei, *this);
            if(!visited[u]){
                level[u] = this->level[v]+1;
                this->components[u] = this->nextComponent;
                visited[u]=true;
                queue.push_back(u);
            }
        }
    }
}